

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O2

void IPdr_ManPrintClauses(Vec_Vec_t *vClauses,int kStart,int nRegs)

{
  Vec_Ptr_t *p;
  Pdr_Set_t *p_00;
  int i;
  _func_int_varargs *p_Var1;
  int i_00;
  _func_int_varargs *Vec_PtrSortCompare;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  
  p_Var1 = (_func_int_varargs *)(ulong)(uint)kStart;
  uVar3 = 0;
  while (i = (int)p_Var1, i < vClauses->nSize) {
    Vec_PtrSortCompare = p_Var1;
    p = Vec_VecEntry(vClauses,i);
    Vec_PtrSort(p,Vec_PtrSortCompare);
    for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
      pVVar2 = p;
      p_00 = (Pdr_Set_t *)Vec_PtrEntry(p,i_00);
      Abc_Print((int)pVVar2,"Frame[%4d]Cube[%4d] = ",p_Var1,(ulong)(uVar3 + i_00));
      ZPdr_SetPrint(p_00);
      Abc_Print((int)p_00,"\n");
    }
    uVar3 = uVar3 + i_00;
    p_Var1 = (_func_int_varargs *)(ulong)(i + 1);
  }
  return;
}

Assistant:

void IPdr_ManPrintClauses( Vec_Vec_t * vClauses, int kStart, int nRegs )
{
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, k, Counter = 0;
    Vec_VecForEachLevelStart( vClauses, vArrayK, k, kStart )
    {
        Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, i )
        {
            Abc_Print( 1, "Frame[%4d]Cube[%4d] = ", k, Counter++ );
            // Pdr_SetPrint( stdout, pCube, nRegs, NULL );  
            ZPdr_SetPrint( pCube );  
            Abc_Print( 1, "\n" ); 
        }
    }
}